

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::anon_unknown_1::BaseRenderingCase::init
          (BaseRenderingCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  RenderContext *renderCtx;
  int iVar2;
  int extraout_EAX;
  RenderTarget *pRVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ShaderProgram *this_00;
  NotSupportedError *pNVar4;
  long *plVar5;
  TestError *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long *plVar7;
  long lVar8;
  float range [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  StringTemplate fragmentSource;
  undefined1 local_2b0 [16];
  char local_2a0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  undefined1 local_288 [16];
  char local_278 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  _Base_ptr local_220;
  size_t local_218;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  undefined1 local_100 [208];
  
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = pRVar3->m_width;
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((iVar2 < this->m_renderSize) || (pRVar3->m_height < this->m_renderSize)) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_288._0_8_ = local_278;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_288,"Render target size must be at least ","");
    de::toString<int>((string *)local_260,&this->m_renderSize);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
    plVar5 = (long *)std::__cxx11::string::append(local_2b0);
    local_240._0_8_ = *plVar5;
    plVar7 = plVar5 + 2;
    if ((long *)local_240._0_8_ == plVar7) {
      local_240._16_8_ = *plVar7;
      local_240._24_8_ = plVar5[3];
      local_240._0_8_ = local_240 + 0x10;
    }
    else {
      local_240._16_8_ = *plVar7;
    }
    local_240._8_8_ = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    de::toString<int>(&local_210,&this->m_renderSize);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                   &local_210);
    tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)local_1b0);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if ((this->m_lineWidth != 1.0) || (NAN(this->m_lineWidth))) {
    local_260._0_8_ = (pointer)0x0;
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x818))(0x846e,local_260);
    if ((this->m_lineWidth < (float)local_260._0_4_) || ((float)local_260._4_4_ < this->m_lineWidth)
       ) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_2b0._0_8_ = local_2a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b0,"Support for line width ","");
      de::toString<float>((string *)local_288,&this->m_lineWidth);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288)
      ;
      plVar5 = (long *)std::__cxx11::string::append(local_240);
      local_1b0._0_8_ = *plVar5;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ == paVar6) {
        local_1a0[0]._0_8_ = paVar6->_M_allocated_capacity;
        local_1a0[0]._8_8_ = plVar5[3];
        local_1b0._0_8_ = local_1a0;
      }
      else {
        local_1a0[0]._0_8_ = paVar6->_M_allocated_capacity;
      }
      local_1b0._8_8_ = plVar5[1];
      *plVar5 = (long)paVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)local_1b0);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"ALIASED_LINE_WIDTH_RANGE = [",0x1c);
    std::ostream::_M_insert<double>((double)(float)local_260._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<double>((double)(float)local_260._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  if ((this->m_pointSize != 1.0) || (NAN(this->m_pointSize))) {
    local_260._0_8_ = (pointer)0x0;
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x818))(0x846d,local_260);
    if ((this->m_pointSize < (float)local_260._0_4_) || ((float)local_260._4_4_ < this->m_pointSize)
       ) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_2b0._0_8_ = local_2a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b0,"Support for point size ","");
      de::toString<float>((string *)local_288,&this->m_pointSize);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288)
      ;
      plVar5 = (long *)std::__cxx11::string::append(local_240);
      local_1b0._0_8_ = *plVar5;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ == paVar6) {
        local_1a0[0]._0_8_ = paVar6->_M_allocated_capacity;
        local_1a0[0]._8_8_ = plVar5[3];
        local_1b0._0_8_ = local_1a0;
      }
      else {
        local_1a0[0]._0_8_ = paVar6->_M_allocated_capacity;
      }
      local_1b0._8_8_ = plVar5[1];
      *plVar5 = (long)paVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)local_1b0);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"ALIASED_POINT_SIZE_RANGE = [",0x1c);
    std::ostream::_M_insert<double>((double)(float)local_260._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<double>((double)(float)local_260._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  this->m_numSamples = pRVar3->m_numSamples;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar2) + 0x868))(0xd50,&this->m_subpixelBits);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Sample count = ",0xf);
  std::ostream::operator<<(poVar1,this->m_numSamples);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"SUBPIXEL_BITS = ",0x10);
  std::ostream::operator<<(poVar1,this->m_subpixelBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,
             "attribute highp vec4 a_position;\nattribute highp vec4 a_color;\nvarying highp vec4 v_color;\nuniform highp float u_pointSize;\nvoid main ()\n{\n\tgl_Position = a_position;\n\tgl_PointSize = u_pointSize;\n\tv_color = a_color;\n}\n"
             ,"");
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_260,(string *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,
             "varying mediump vec4 v_color;\nvoid main ()\n{\n\tgl_FragColor = v_color;\n}\n","");
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_210,(string *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  local_240._24_8_ = local_240 + 8;
  local_240._8_8_ = (ulong)(uint)local_240._12_4_ << 0x20;
  local_240._16_8_ = (_Base_ptr)0x0;
  local_218 = 0;
  local_220 = (_Base_ptr)local_240._24_8_;
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_100[0x10] = 0;
  local_100._17_8_ = 0;
  local_100._0_8_ = (pointer)0x0;
  local_100[8] = 0;
  local_100._9_7_ = 0;
  memset(local_1b0,0,0xac);
  tcu::StringTemplate::specialize
            (&local_1d0,(StringTemplate *)local_260,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_240);
  local_2b0._0_8_ = (ulong)(uint)local_2b0._4_4_ << 0x20;
  local_2b0._8_8_ = &local_298;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2b0 + 8),local_1d0._M_dataplus._M_p,
             local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (local_2b0._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2b0 + 8));
  tcu::StringTemplate::specialize
            (&local_1f0,(StringTemplate *)&local_210,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_240);
  local_288._0_4_ = 1;
  local_288._8_8_ = &local_270;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_288 + 8),local_1f0._M_dataplus._M_p,
             local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (local_288._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_288 + 8));
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_1b0);
  this->m_shader = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._8_8_ != &local_270) {
    operator_delete((void *)local_288._8_8_,local_270._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._8_8_ != &local_298) {
    operator_delete((void *)local_2b0._8_8_,local_298._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_100);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_120);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  if ((this->m_shader->m_program).m_info.linkOk != false) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_240);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_210);
    tcu::StringTemplate::~StringTemplate((StringTemplate *)local_260);
    return extraout_EAX;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"could not create shader","");
  tcu::TestError::TestError(this_01,(string *)local_1b0);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BaseRenderingCase::init (void)
{
	const int width	 = m_context.getRenderTarget().getWidth();
	const int height = m_context.getRenderTarget().getHeight();

	// Requirements

	if (width < m_renderSize || height < m_renderSize)
		throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(m_renderSize) + "x" + de::toString(m_renderSize));

	if (m_lineWidth != 1.0f)
	{
		float range[2] = { 0.0f, 0.0f };
		m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_LINE_WIDTH_RANGE, range);

		if (m_lineWidth < range[0] || m_lineWidth > range[1])
			throw tcu::NotSupportedError(std::string("Support for line width ") + de::toString(m_lineWidth) + " is required.");

		m_testCtx.getLog() << tcu::TestLog::Message << "ALIASED_LINE_WIDTH_RANGE = [" << range[0] << ", " << range[1] << "]" << tcu::TestLog::EndMessage;
	}

	if (m_pointSize != 1.0f)
	{
		float range[2] = { 0.0f, 0.0f };
		m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_POINT_SIZE_RANGE, range);

		if (m_pointSize < range[0] || m_pointSize > range[1])
			throw tcu::NotSupportedError(std::string("Support for point size ") + de::toString(m_pointSize) + " is required.");

		m_testCtx.getLog() << tcu::TestLog::Message << "ALIASED_POINT_SIZE_RANGE = [" << range[0] << ", " << range[1] << "]" << tcu::TestLog::EndMessage;
	}

	// Query info

	m_numSamples = m_context.getRenderTarget().getNumSamples();
	m_context.getRenderContext().getFunctions().getIntegerv(GL_SUBPIXEL_BITS, &m_subpixelBits);

	m_testCtx.getLog() << tcu::TestLog::Message << "Sample count = " << m_numSamples << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "SUBPIXEL_BITS = " << m_subpixelBits << tcu::TestLog::EndMessage;

	// Gen shader

	{
		tcu::StringTemplate					vertexSource	(s_shaderVertexTemplate);
		tcu::StringTemplate					fragmentSource	(s_shaderFragmentTemplate);
		std::map<std::string, std::string>	params;

		m_shader = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexSource.specialize(params)) << glu::FragmentSource(fragmentSource.specialize(params)));
		if (!m_shader->isOk())
			throw tcu::TestError("could not create shader");
	}
}